

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::NearestNeighborsIndex::SerializeWithCachedSizes
          (NearestNeighborsIndex *this,CodedOutputStream *output)

{
  int iVar1;
  uint32 uVar2;
  Type *value;
  int index;
  
  if (this->numberofdimensions_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(1,this->numberofdimensions_,output);
  }
  iVar1 = (this->floatsamples_).super_RepeatedPtrFieldBase.current_size_;
  for (index = 0; iVar1 != index; index = index + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                      (&(this->floatsamples_).super_RepeatedPtrFieldBase,index);
    google::protobuf::internal::WireFormatLite::WriteMessage(2,&value->super_MessageLite,output);
  }
  uVar2 = this->_oneof_case_[0];
  if (uVar2 == 100) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (100,&((this->IndexType_).linearindex_)->super_MessageLite,output);
    uVar2 = this->_oneof_case_[0];
  }
  if (uVar2 == 0x6e) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x6e,&((this->IndexType_).linearindex_)->super_MessageLite,output);
  }
  if (this->_oneof_case_[1] == 200) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (200,&((this->DistanceFunction_).squaredeuclideandistance_)->super_MessageLite,output)
    ;
    return;
  }
  return;
}

Assistant:

void NearestNeighborsIndex::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.NearestNeighborsIndex)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int32 numberOfDimensions = 1;
  if (this->numberofdimensions() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(1, this->numberofdimensions(), output);
  }

  // repeated .CoreML.Specification.FloatVector floatSamples = 2;
  for (unsigned int i = 0, n = this->floatsamples_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, this->floatsamples(i), output);
  }

  // .CoreML.Specification.LinearIndex linearIndex = 100;
  if (has_linearindex()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      100, *IndexType_.linearindex_, output);
  }

  // .CoreML.Specification.SingleKdTreeIndex singleKdTreeIndex = 110;
  if (has_singlekdtreeindex()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      110, *IndexType_.singlekdtreeindex_, output);
  }

  // .CoreML.Specification.SquaredEuclideanDistance squaredEuclideanDistance = 200;
  if (has_squaredeuclideandistance()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      200, *DistanceFunction_.squaredeuclideandistance_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.NearestNeighborsIndex)
}